

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O0

void add_section(int pass,section_type_t type,int address,int bank)

{
  section_s *psVar1;
  section_t *psVar2;
  int in_ECX;
  int in_EDX;
  section_type_t in_ESI;
  int in_EDI;
  block_header_t header;
  section_t *new;
  section_entry_t sect_entry;
  
  if (in_EDI == 1) {
    psVar2 = (section_t *)malloc(0x20);
    if (psVar2 == (section_t *)0x0) {
      ccerr(F,"unable to allocate memory");
    }
    psVar1 = psVar2;
    if (root != (section_t *)0x0) {
      cur->next = psVar2;
      psVar2 = root;
      psVar1 = cur->next;
    }
    cur = psVar1;
    root = psVar2;
    cur->type = in_ESI;
    cur->id = num_sections;
    cur->offset = in_EDX;
    cur->bank = in_ECX;
    cur->pc = 0;
    cur->datasize = 0;
    cur->next = (section_s *)0x0;
    num_sections = num_sections + 1;
  }
  else {
    if (cur->next == (section_s *)0x0) {
      cur = root;
      write_block_header((block_header_t *)0x108a11);
    }
    else {
      cur = cur->next;
    }
    cur->pc = 0;
    write_section_entry((section_entry_t *)0x108a82);
  }
  return;
}

Assistant:

void add_section(int pass, section_type_t type, int address, int bank)
{
    section_entry_t sect_entry;
    
    /* PASS 1 : Create a new section */
    if (pass == READ_PASS)
    {
        section_t* new = (section_t*)malloc(sizeof(section_t));
        if (new == NULL)
            ccerr(F, "unable to allocate memory");

        if (!root)
        {
            root = new;
            cur = root;
        }
        else
        {
            cur->next = new;
            cur = cur->next;
        }

        cur->type = type;
        cur->id = num_sections;
        cur->offset = address;
        cur->bank = bank;
        cur->pc = 0;
        cur->datasize = 0;
        cur->next = NULL;
        ++num_sections;
    }
    else /* PASS 2 */
    {
        if (cur->next == NULL) /* First section : write the block header */
        {
            block_header_t header;
            header.type = sections;
            header.num_entries = num_sections;
            cur = root;
            write_block_header(&header);
        }
        else
            cur = cur->next;

        cur->pc = 0;

        /* New section : use new header */
        sect_entry.id = cur->id;
        sect_entry.type = cur->type;
        sect_entry.offset = cur->offset;
        sect_entry.bank_num = cur->bank;
        sect_entry.data_size = cur->datasize;
        write_section_entry(&sect_entry);
    }
}